

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDistance.cpp
# Opt level: O1

void __thiscall chrono::ChLinkDistance::ChLinkDistance(ChLinkDistance *this,ChLinkDistance *other)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  ChLink::ChLink(&this->super_ChLink,&other->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkDistance_00b3de08;
  (this->pos1).m_data[0] = 0.0;
  (this->pos1).m_data[1] = 0.0;
  (this->pos1).m_data[2] = 0.0;
  (this->pos2).m_data[0] = 0.0;
  (this->pos1).m_data[2] = 0.0;
  (this->pos2).m_data[0] = 0.0;
  (this->pos2).m_data[1] = 0.0;
  (this->pos2).m_data[2] = 0.0;
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->Cx);
  (this->super_ChLink).Body1 = (other->super_ChLink).Body1;
  (this->super_ChLink).Body2 = (other->super_ChLink).Body2;
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.system =
       (other->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.system;
  iVar1 = (*(((other->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar2 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->Cx,(ChVariables *)CONCAT44(extraout_var,iVar1),
             (ChVariables *)CONCAT44(extraout_var_00,iVar2));
  if (other != this) {
    (this->pos1).m_data[0] = (other->pos1).m_data[0];
    (this->pos1).m_data[1] = (other->pos1).m_data[1];
    (this->pos1).m_data[2] = (other->pos1).m_data[2];
    (this->pos2).m_data[0] = (other->pos2).m_data[0];
    (this->pos2).m_data[1] = (other->pos2).m_data[1];
    (this->pos2).m_data[2] = (other->pos2).m_data[2];
  }
  this->distance = other->distance;
  this->curr_dist = other->curr_dist;
  return;
}

Assistant:

ChLinkDistance::ChLinkDistance(const ChLinkDistance& other) : ChLink(other) {
    Body1 = other.Body1;
    Body2 = other.Body2;
    system = other.system;
    Cx.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());
    pos1 = other.pos1;
    pos2 = other.pos2;
    distance = other.distance;
    curr_dist = other.curr_dist;
}